

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O0

void * pthNotifyThread(void *x)

{
  uint uVar1;
  ulong uVar2;
  uint *in_RDI;
  gpioReport_t report [4096];
  int r;
  int bytes;
  int pi;
  undefined8 local_c018;
  undefined8 local_c010 [3];
  gpioReport_t *in_stack_ffffffffffff4008;
  int in_stack_ffffffffffff4014;
  int local_14;
  
  uVar1 = *in_RDI;
  free(in_RDI);
  while( true ) {
    uVar2 = read(gPigNotify[(int)uVar1],(void *)((long)local_c010 + (long)pthNotifyThread::got + -8)
                 ,0xc000 - (long)pthNotifyThread::got);
    if ((int)uVar2 < 1) break;
    local_14 = 0;
    for (pthNotifyThread::got = (int)uVar2 + pthNotifyThread::got; 0xb < (uint)pthNotifyThread::got;
        pthNotifyThread::got = pthNotifyThread::got + -0xc) {
      dispatch_notification(in_stack_ffffffffffff4014,in_stack_ffffffffffff4008);
      local_14 = local_14 + 1;
    }
    if ((pthNotifyThread::got != 0) && (local_14 != 0)) {
      local_c018 = *(undefined8 *)((long)local_c010 + ((long)local_14 * 3 + -2) * 4);
      local_c010[0]._0_4_ = *(undefined4 *)((long)local_c010 + (long)local_14 * 0xc);
    }
  }
  fprintf(_stderr,"notify thread for pi %d broke with read error %d\n",(ulong)uVar1,
          uVar2 & 0xffffffff);
  do {
    sleep(1);
  } while( true );
}

Assistant:

static void *pthNotifyThread(void *x)
{
   static int got = 0;
   int pi;
   int bytes, r;
   gpioReport_t report[PI_MAX_REPORTS_PER_READ];

   pi = *((int*)x);
   free(x); /* memory allocated in pigpio_start */

   while (1)
   {
      bytes = read(gPigNotify[pi], (char*)&report+got, sizeof(report)-got);

      if (bytes > 0) got += bytes;
      else break;

      r = 0;

      while (got >= sizeof(gpioReport_t))
      {
         dispatch_notification(pi, &report[r]);

         r++;

         got -= sizeof(gpioReport_t);
      }

      /* copy any partial report to start of array */
      
      if (got && r) report[0] = report[r];
   }

   fprintf(stderr, "notify thread for pi %d broke with read error %d\n",
      pi, bytes);

   while (1) sleep(1);

   return NULL;
}